

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

Heartbeat *
anon_unknown.dwarf_334836::createHeartbeat
          (Heartbeat *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  FieldBase local_70;
  
  FIX42::Heartbeat::Heartbeat(__return_storage_ptr__);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,"ISLD","TW",(int)sender);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_70,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_70,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  return __return_storage_ptr__;
}

Assistant:

FIX42::Heartbeat createHeartbeat(const char *sender, const char *target, int seq) {
  FIX42::Heartbeat heartbeat;
  fillHeader(heartbeat.getHeader(), sender, target, seq);
  heartbeat.getHeader().setField(BodyLength(heartbeat.bodyLength()));
  heartbeat.getTrailer().setField(CheckSum(heartbeat.checkSum()));
  return heartbeat;
}